

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall
BuildTestDyndepBuildDiscoverCircular::Run(BuildTestDyndepBuildDiscoverCircular *this)

{
  VirtualFileSystem *this_00;
  int iVar1;
  Test *pTVar2;
  bool bVar3;
  bool condition;
  Node *pNVar4;
  Builder *this_01;
  string err;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  iVar1 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,
              "rule r\n  command = unused\nrule cp\n  command = cp $in $out\nbuild dd: cp dd-in\nbuild out: r in || dd\n  depfile = out.d\n  dyndep = dd\nbuild in: r || dd\n  dyndep = dd\n"
              ,(ManifestParserOptions)0x0);
  if (iVar1 == g_current_test->assertion_failures_) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"out.d",&local_62);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"out: inimp\n",&local_61)
    ;
    this_00 = &(this->super_BuildTest).fs_;
    VirtualFileSystem::Create(this_00,&local_60,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"dd-in",&local_62);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "ninja_dyndep_version = 1\nbuild out | circ: dyndep\nbuild in: dyndep | circ\n",
               &local_61);
    VirtualFileSystem::Create(this_00,&local_60,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"out",&local_62);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_61);
    VirtualFileSystem::Create(this_00,&local_60,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    pTVar2 = g_current_test;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"out",&local_62);
    this_01 = &(this->super_BuildTest).builder_;
    pNVar4 = Builder::AddTarget(this_01,&local_40,&local_60);
    testing::Test::Check
              (pTVar2,pNVar4 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0xd8d,"builder_.AddTarget(\"out\", &err)");
    std::__cxx11::string::~string((string *)&local_40);
    pTVar2 = g_current_test;
    bVar3 = std::operator==("",&local_60);
    testing::Test::Check
              (pTVar2,bVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0xd8e,"\"\" == err");
    pTVar2 = g_current_test;
    bVar3 = Builder::Build(this_01,&local_60);
    testing::Test::Check
              (pTVar2,!bVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0xd90,"builder_.Build(&err)");
    pTVar2 = g_current_test;
    bVar3 = std::operator==(&local_60,"dependency cycle: circ -> in -> circ");
    condition = true;
    if (!bVar3) {
      condition = std::operator==(&local_60,"dependency cycle: in -> circ -> in");
    }
    testing::Test::Check
              (pTVar2,condition,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0xd94,
               "err == \"dependency cycle: circ -> in -> circ\" || err == \"dependency cycle: in -> circ -> in\""
              );
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(BuildTest, DyndepBuildDiscoverCircular) {
  // Verify that a dyndep file can be built and loaded to discover
  // and reject a circular dependency.
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule r\n"
"  command = unused\n"
"rule cp\n"
"  command = cp $in $out\n"
"build dd: cp dd-in\n"
"build out: r in || dd\n"
"  depfile = out.d\n"
"  dyndep = dd\n"
"build in: r || dd\n"
"  dyndep = dd\n"
  ));
  fs_.Create("out.d", "out: inimp\n");
  fs_.Create("dd-in",
"ninja_dyndep_version = 1\n"
"build out | circ: dyndep\n"
"build in: dyndep | circ\n"
  );
  fs_.Create("out", "");

  string err;
  EXPECT_TRUE(builder_.AddTarget("out", &err));
  EXPECT_EQ("", err);

  EXPECT_FALSE(builder_.Build(&err));
  // Depending on how the pointers in Plan::ready_ work out, we could have
  // discovered the cycle from either starting point.
  EXPECT_TRUE(err == "dependency cycle: circ -> in -> circ" ||
              err == "dependency cycle: in -> circ -> in");
}